

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::_next_node(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  pfn_error p_Var1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  byte bVar18;
  csubstr cVar19;
  _lookup_path_token local_170;
  char msg [46];
  char *pcStack_f0;
  size_t local_e8;
  char *pcStack_c8;
  size_t local_c0;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  size_t idx;
  size_t sStack_38;
  
  bVar18 = 0;
  _next_token(&local_170,this,r,parent);
  sVar13 = 0xffffffffffffffff;
  if (local_170.type.type == NOTYPE) {
    return 0xffffffffffffffff;
  }
  sVar12 = local_170.value.len;
  switch(local_170.type.type) {
  case KEY:
    if (((local_170.value.len == 0) || (*local_170.value.str != '[')) ||
       (local_170.value.str[local_170.value.len - 1] != ']')) {
      pcVar15 = "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pcVar16 = msg;
      for (lVar14 = 0x4b; lVar14 != 0; lVar14 = lVar14 + -1) {
        *pcVar16 = *pcVar15;
        pcVar15 = pcVar15 + (ulong)bVar18 * -2 + 1;
        pcVar16 = pcVar16 + (ulong)bVar18 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_c0 = cVar19.len;
      pcStack_c8 = cVar19.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6920) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6920) << 0x40,8);
      LVar7.name.str = pcStack_c8;
      LVar7.name.len = local_c0;
      (*p_Var1)(msg,0x4b,LVar7,(this->m_callbacks).m_user_data);
      if (local_170.value.len == 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          sVar13 = (*pcVar3)();
          return sVar13;
        }
        handle_error(0x1ea013,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1560,"left >= 0 && left <= len");
      }
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,local_170.value.str + 1,local_170.value.len - 2);
    idx._0_1_ = msg[0];
    idx._1_1_ = msg[1];
    idx._2_1_ = msg[2];
    idx._3_1_ = msg[3];
    idx._4_1_ = msg[4];
    idx._5_1_ = msg[5];
    idx._6_1_ = msg[6];
    idx._7_1_ = msg[7];
    sStack_38._0_1_ = msg[8];
    sStack_38._1_1_ = msg[9];
    sStack_38._2_1_ = msg[10];
    sStack_38._3_1_ = msg[0xb];
    sStack_38._4_1_ = msg[0xc];
    sStack_38._5_1_ = msg[0xd];
    sStack_38._6_1_ = msg[0xe];
    sStack_38._7_1_ = msg[0xf];
    local_170.value = basic_substring<const_char>::trim((basic_substring<const_char> *)&idx,' ');
    idx = 0;
    cVar19.len = (size_t)&idx;
    cVar19.str = (char *)local_170.value.len;
    bVar9 = atou<unsigned_long>((c4 *)local_170.value.str,cVar19,&idx);
    if (!bVar9) {
      builtin_strncpy(msg + 0x10,"om_chars(token.value, &idx)",0x1c);
      builtin_strncpy(msg,"check failed: fr",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_e8 = cVar19.len;
      pcStack_f0 = cVar19.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6923) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x6923) << 0x40,8);
      LVar8.name.str = pcStack_f0;
      LVar8.name.len = local_e8;
      (*p_Var1)(msg,0x2c,LVar8,(this->m_callbacks).m_user_data);
    }
    sVar11 = child(this,r->closest,idx);
    break;
  case KEYVAL:
    cVar19 = lookup_result::unresolved(r);
    if (cVar19.str != (char *)0x0 && cVar19.len != 0) {
      builtin_strncpy(msg,"check failed: (r->unresolved().empty())",0x28);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_98 = cVar19.len;
      pcStack_a0 = cVar19.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x691a) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x691a) << 0x40,8);
      LVar6.name.str = pcStack_a0;
      LVar6.name.len = local_98;
      (*p_Var1)(msg,0x28,LVar6,(this->m_callbacks).m_user_data);
    }
    pNVar10 = _p(this,r->closest);
    if (((pNVar10->m_type).type & MAP) != NOTYPE) goto LAB_001bf768;
    goto LAB_001bf970;
  case MAP:
  case SEQ:
    if ((local_170.value.len != 0) && (*local_170.value.str == '[')) {
      builtin_strncpy(msg + 0x10,"token.value.begins_with(\'[\'))",0x1e);
      builtin_strncpy(msg,"check failed: (!",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_48 = cVar19.len;
      pcStack_50 = cVar19.str;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6913) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x6913) << 0x40,8);
      LVar4.name.str = pcStack_50;
      LVar4.name.len = local_48;
      (*p_Var1)(msg,0x2e,LVar4,(this->m_callbacks).m_user_data);
    }
    pNVar10 = _p(this,r->closest);
    if (((pNVar10->m_type).type & MAP) == NOTYPE) {
      builtin_strncpy(msg,"check failed: (is_map(r->closest))",0x23);
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_70 = cVar19.len;
      pcStack_78 = cVar19.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6915) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x6915) << 0x40,8);
      LVar5.name.str = pcStack_78;
      LVar5.name.len = local_70;
      (*p_Var1)(msg,0x23,LVar5,(this->m_callbacks).m_user_data);
    }
LAB_001bf768:
    sVar11 = find_child(this,r->closest,&local_170.value);
    break;
  default:
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      sVar13 = (*pcVar3)();
      return sVar13;
    }
    handle_error(0x1fd9a3,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x6928);
  }
  if (sVar11 == 0xffffffffffffffff) {
LAB_001bf970:
    uVar17 = 0;
    if (r->path_pos != 0) {
      uVar17 = r->path_pos - 1;
    }
    uVar2 = (r->path).len;
    if (uVar2 < uVar17) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        sVar13 = (*pcVar3)();
        return sVar13;
      }
      handle_error(0x1ea013,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,(r->path).str + uVar17,uVar2 - uVar17);
    sVar12 = r->path_pos - sVar12;
    r->path_pos = sVar12;
    if ((msg._8_8_ != 0) && (*(char *)msg._0_8_ == '.')) {
      r->path_pos = sVar12 - 1;
    }
  }
  else {
    (parent->type).type = local_170.type.type;
    (parent->value).str = local_170.value.str;
    (parent->value).len = local_170.value.len;
    sVar13 = sVar11;
  }
  return sVar13;
}

Assistant:

size_t Tree::_next_node(lookup_result * r, _lookup_path_token *parent) const
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    csubstr prev = token.value;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
        node = find_child(r->closest, token.value);
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
            node = find_child(r->closest, token.value);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx = 0;
        _RYML_CB_CHECK(m_callbacks, from_chars(token.value, &idx));
        node = child(r->closest, idx);
    }
    else
    {
        C4_NEVER_REACH();
    }

    if(node != NONE)
    {
        *parent = token;
    }
    else
    {
        csubstr p = r->path.sub(r->path_pos > 0 ? r->path_pos - 1 : r->path_pos);
        r->path_pos -= prev.len;
        if(p.begins_with('.'))
            r->path_pos -= 1u;
    }

    return node;
}